

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall polyscope::SlicePlane::~SlicePlane(SlicePlane *this)

{
  string *in_RDI;
  string *in_stack_00000038;
  SlicePlane *in_stack_00000040;
  string *in_stack_000000f8;
  Engine *in_stack_00000100;
  TransformationGizmo *this_00;
  array<polyscope::render::ManagedBuffer<unsigned_int>,_4UL> *in_stack_ffffffffffffffb0;
  undefined1 local_29 [25];
  SlicePlane *in_stack_fffffffffffffff0;
  
  ensureVolumeInspectValid(in_stack_fffffffffffffff0);
  this_00 = (TransformationGizmo *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_29 + 1),"",(allocator *)this_00);
  setVolumeMeshToInspect(in_stack_00000040,in_stack_00000038);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,in_RDI + 0x20);
  render::Engine::removeSlicePlane(in_stack_00000100,in_stack_000000f8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x460bc4);
  std::array<polyscope::render::ManagedBuffer<unsigned_int>,_4UL>::~array(in_stack_ffffffffffffffb0)
  ;
  std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>::~array
            ((array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL> *)
             in_stack_ffffffffffffffb0);
  TransformationGizmo::~TransformationGizmo(this_00);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x460c08);
  std::__cxx11::string::~string(in_RDI + 0x1b0);
  PersistentValue<float>::~PersistentValue((PersistentValue<float> *)0x460c2a);
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::~PersistentValue
            ((PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *)0x460c3b);
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::~PersistentValue
            ((PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *)0x460c4c);
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::~PersistentValue
            ((PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)0x460c5d);
  PersistentValue<bool>::~PersistentValue((PersistentValue<bool> *)0x460c6e);
  PersistentValue<bool>::~PersistentValue((PersistentValue<bool> *)0x460c7c);
  PersistentValue<bool>::~PersistentValue((PersistentValue<bool> *)0x460c8a);
  std::__cxx11::string::~string(in_RDI + 0x20);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

SlicePlane::~SlicePlane() {
  ensureVolumeInspectValid();
  setVolumeMeshToInspect(""); // disable any slicing
  render::engine->removeSlicePlane(postfix);
}